

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserMhapTest_ParseWhole_Test::~BioparserMhapTest_ParseWhole_Test
          (BioparserMhapTest_ParseWhole_Test *this)

{
  BioparserMhapTest_ParseWhole_Test *this_local;
  
  ~BioparserMhapTest_ParseWhole_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserMhapTest, ParseWhole) {
  Setup("sample.mhap");
  o = p->Parse(-1);
  Check();
}